

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.cpp
# Opt level: O1

string * __thiscall
iDynTree::Triplets::description_abi_cxx11_(string *__return_storage_ptr__,Triplets *this)

{
  ostream *poVar1;
  pointer pTVar2;
  ostringstream str;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pTVar2 = (this->m_triplets).
           super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (this->m_triplets).
                super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      poVar1 = std::ostream::_M_insert<double>(pTVar2->value);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != (this->m_triplets).
                       super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Triplets::description() const
    {
        std::ostringstream str;
        for (const_iterator triplet(begin()); triplet != end(); ++triplet) {
            str << "(" << triplet->row << "," << triplet->column << ")" << triplet->value << std::endl;
        }
        return str.str();
    }